

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O0

void TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  int64_t iVar4;
  long in_RSI;
  double dVar5;
  int x_3;
  int x_2;
  int fi;
  int ifunc;
  int64_t newfuncs;
  TPZVec<int> filtVecShape;
  int x_1;
  int x;
  int fss;
  int ie;
  int fcount;
  TPZFMatrix<double> curlphi_unfilt;
  TPZFMatrix<double> phi_unfilt;
  int i;
  int n_unfilt;
  TPZManVector<int,_15> first_hcurl_side;
  TPZManVector<int,_27> *connectorders;
  int nedges;
  int curldim;
  int dim;
  int ncon;
  int nsides;
  int ncorner;
  TPZManVector<int,_15> *in_stack_fffffffffffffd10;
  double *in_stack_fffffffffffffd20;
  _func_int **in_stack_fffffffffffffd28;
  TPZFMatrix<double> *in_stack_fffffffffffffd30;
  int64_t in_stack_fffffffffffffd38;
  TPZManVector<int,_15> *in_stack_fffffffffffffd40;
  int64_t in_stack_fffffffffffffd48;
  TPZFMatrix<double> *in_stack_fffffffffffffd50;
  TPZFMatrix<double> *in_stack_fffffffffffffd78;
  TPZFMatrix<double> *in_stack_fffffffffffffd80;
  TPZShapeData *in_stack_fffffffffffffd88;
  TPZVec<double> *in_stack_fffffffffffffd90;
  TPZVec<int> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  TPZVec<int> *in_stack_fffffffffffffdc0;
  int local_228;
  int local_224;
  int local_21c;
  TPZVec<int> local_210;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_b8;
  int local_a8;
  undefined4 local_a4;
  TPZVec<int> local_a0 [3];
  TPZVec<int> *local_40;
  int local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  long local_10;
  
  local_24 = 6;
  local_28 = 0x15;
  local_2c = 0xf;
  local_30 = 3;
  local_34 = 3;
  local_10 = in_RSI;
  local_38 = pztopology::TPZPrism::NumSides(0x18d6768);
  local_40 = (TPZVec<int> *)(local_10 + 0x2b50);
  local_a4 = 0;
  TPZManVector<int,_15>::TPZManVector
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30);
  local_a8 = 0;
  TPZVec<int>::operator[](local_40,0);
  iVar1 = TPZShapeHCurl<pzshape::TPZShapePrism>::ComputeNConnectShapeF
                    ((int)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20))
  ;
  local_a8 = iVar1 + local_a8;
  for (local_b8 = 1; local_b8 < 0xf; local_b8 = local_b8 + 1) {
    in_stack_fffffffffffffdbc = local_a8;
    in_stack_fffffffffffffdc0 = (TPZVec<int> *)TPZVec<int>::operator[](local_a0,(long)local_b8);
    *(int *)&in_stack_fffffffffffffdc0->_vptr_TPZVec = in_stack_fffffffffffffdbc;
    in_stack_fffffffffffffdb0 = (TPZVec<int> *)TPZVec<int>::operator[](local_40,(long)local_b8);
    iVar1 = TPZShapeHCurl<pzshape::TPZShapePrism>::ComputeNConnectShapeF
                      ((int)in_stack_fffffffffffffd40,
                       (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    local_a8 = iVar1 + local_a8;
  }
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,(int64_t)in_stack_fffffffffffffd40)
  ;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,(int64_t)in_stack_fffffffffffffd40)
  ;
  TPZShapeHCurl<pzshape::TPZShapePrism>::Shape
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  local_1dc = 0;
  for (local_1e0 = 0; local_1e0 < local_38; local_1e0 = local_1e0 + 1) {
    piVar2 = TPZVec<int>::operator[](local_a0,(long)local_1e0);
    local_1e4 = *piVar2;
    for (local_1e8 = 0; local_1e8 < 3; local_1e8 = local_1e8 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                          (int64_t)in_stack_fffffffffffffd20);
      dVar5 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                          (int64_t)in_stack_fffffffffffffd20);
      dVar5 = dVar5 + *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                          (int64_t)in_stack_fffffffffffffd20);
      *pdVar3 = dVar5;
    }
    for (local_1ec = 0; local_1ec < 3; local_1ec = local_1ec + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                          (int64_t)in_stack_fffffffffffffd20);
      dVar5 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                          (int64_t)in_stack_fffffffffffffd20);
      dVar5 = dVar5 + *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                          (int64_t)in_stack_fffffffffffffd20);
      *pdVar3 = dVar5;
    }
    local_1dc = local_1dc + 1;
  }
  TPZVec<int>::TPZVec(&local_210);
  HighOrderFunctionsFilter
            (in_stack_fffffffffffffdc0,
             (TPZVec<int> *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0);
  iVar4 = TPZVec<int>::size(&local_210);
  for (local_21c = 0; local_21c < iVar4; local_21c = local_21c + 1) {
    TPZVec<int>::operator[](&local_210,(long)local_21c);
    for (local_224 = 0; local_224 < 3; local_224 = local_224 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                          (int64_t)in_stack_fffffffffffffd20);
      in_stack_fffffffffffffd28 = (_func_int **)*pdVar3;
      in_stack_fffffffffffffd30 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                      (int64_t)in_stack_fffffffffffffd20);
      (in_stack_fffffffffffffd30->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = in_stack_fffffffffffffd28;
    }
    for (local_228 = 0; local_228 < 3; local_228 = local_228 + 1) {
      in_stack_fffffffffffffd20 =
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                      (int64_t)in_stack_fffffffffffffd20);
      in_stack_fffffffffffffd10 = (TPZManVector<int,_15> *)*in_stack_fffffffffffffd20;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28,
                          (int64_t)in_stack_fffffffffffffd20);
      *pdVar3 = (double)in_stack_fffffffffffffd10;
    }
    local_1dc = local_1dc + 1;
  }
  TPZVec<int>::~TPZVec(&in_stack_fffffffffffffd10->super_TPZVec<int>);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d6dd8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d6de5);
  TPZManVector<int,_15>::~TPZManVector(in_stack_fffffffffffffd10);
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}